

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3OpenTable(Parse *pParse,int iCur,int iDb,Table *pTab,int opcode)

{
  Vdbe *p;
  Index *pIdx;
  
  p = pParse->pVdbe;
  if (pParse->db->noSharedCache == '\0') {
    sqlite3TableLock(pParse,iDb,pTab->tnum,opcode == 0x71,pTab->zName);
  }
  if ((pTab->tabFlags & 0x80) == 0) {
    sqlite3VdbeAddOp4Int(p,opcode,iCur,pTab->tnum,iDb,(int)pTab->nNVCol);
    return;
  }
  for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
    if ((*(ushort *)&pIdx->field_0x63 & 3) == 2) goto LAB_0016b147;
  }
  pIdx = (Index *)0x0;
LAB_0016b147:
  sqlite3VdbeAddOp3(p,opcode,iCur,pIdx->tnum,iDb);
  sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3OpenTable(
  Parse *pParse,  /* Generate code into this VDBE */
  int iCur,       /* The cursor number of the table */
  int iDb,        /* The database index in sqlite3.aDb[] */
  Table *pTab,    /* The table to be opened */
  int opcode      /* OP_OpenRead or OP_OpenWrite */
){
  Vdbe *v;
  assert( !IsVirtual(pTab) );
  assert( pParse->pVdbe!=0 );
  v = pParse->pVdbe;
  assert( opcode==OP_OpenWrite || opcode==OP_OpenRead );
  if( !pParse->db->noSharedCache ){
    sqlite3TableLock(pParse, iDb, pTab->tnum,
                     (opcode==OP_OpenWrite)?1:0, pTab->zName);
  }
  if( HasRowid(pTab) ){
    sqlite3VdbeAddOp4Int(v, opcode, iCur, pTab->tnum, iDb, pTab->nNVCol);
    VdbeComment((v, "%s", pTab->zName));
  }else{
    Index *pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk!=0 );
    assert( pPk->tnum==pTab->tnum || CORRUPT_DB );
    sqlite3VdbeAddOp3(v, opcode, iCur, pPk->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    VdbeComment((v, "%s", pTab->zName));
  }
}